

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O1

void btSoftBodyHelpers::Draw(btSoftBody *psb,btIDebugDraw *idraw,int drawflags)

{
  float *pfVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Edge *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Node *pNVar7;
  Link *pLVar8;
  RContact *pRVar9;
  Face *pFVar10;
  long lVar11;
  long lVar12;
  Tetra *pTVar13;
  long lVar14;
  Anchor *pAVar15;
  Note *pNVar16;
  Joint *pJVar17;
  btIDebugDraw *pbVar18;
  undefined1 auVar19 [16];
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  btVector3 *pbVar24;
  btTransform *pbVar25;
  undefined1 auVar26 [8];
  float *pfVar27;
  long lVar28;
  long lVar29;
  Edge *pEVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  btScalar abVar34 [4];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  btScalar bVar39;
  btScalar bVar40;
  btScalar bVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  btAlignedObjectArray<btVector3> vertices;
  btVector3 o;
  btVector3 local_208;
  btAlignedObjectArray<btVector3> local_1f8;
  btIDebugDraw *local_1d0;
  undefined1 local_1c8 [8];
  undefined8 uStack_1c0;
  btScalar local_1b8 [4];
  btSoftBody *local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  btScalar local_178 [4];
  btConvexHullComputer local_168;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [12];
  float fStack_cc;
  undefined1 local_c8 [12];
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_88 = 0x3f8000003f800000;
  uStack_80 = 0x3f800000;
  local_78 = 0x3f800000;
  uStack_70 = 0;
  local_188._0_4_ = drawflags;
  local_1d0 = idraw;
  local_1a0 = psb;
  if (((uint)drawflags >> 8 & 1) == 0) {
    if (((drawflags & 1U) != 0) && (0 < (psb->m_nodes).m_size)) {
      lVar29 = 0x18;
      lVar31 = 0;
      do {
        pNVar7 = (local_1a0->m_nodes).m_data;
        if ((*(byte *)(*(long *)((long)(&pNVar7->m_x + -2) + lVar29) + 0x14) & 1) != 0) {
          local_168.vertices._0_4_ = *(float *)((long)(&pNVar7->m_x + -2) + 8 + lVar29) + -0.1;
          local_168.vertices.m_size = *(undefined4 *)((long)(&pNVar7->m_x + -2) + 0xc + lVar29);
          local_168.vertices.m_capacity =
               *(undefined4 *)
                ((long)&(((Node *)(&pNVar7->m_x + -1))->super_Feature).super_Element.m_tag + lVar29)
          ;
          local_168.vertices._12_4_ = 0.0;
          uVar5 = *(undefined8 *)((long)(&pNVar7->m_x + -2) + 8 + lVar29);
          local_1f8._0_4_ = (float)uVar5 + 0.1;
          local_1f8.m_size = (int)((float)((ulong)uVar5 >> 0x20) + 0.0);
          local_1f8.m_capacity =
               (int)(*(float *)((long)&(((Node *)(&pNVar7->m_x + -1))->super_Feature).super_Element.
                                       m_tag + lVar29) + 0.0);
          local_1f8._12_4_ = 0.0;
          local_208.m_floats = (btScalar  [4])ZEXT816(0x3f800000);
          (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_168,&local_1f8);
          local_168.vertices.m_size =
               (int)(*(float *)((long)(&pNVar7->m_x + -2) + 0xc + lVar29) + -0.1);
          local_168.vertices._0_4_ = *(undefined4 *)((long)(&pNVar7->m_x + -2) + 8 + lVar29);
          local_168.vertices.m_capacity =
               *(undefined4 *)
                ((long)&(((Node *)(&pNVar7->m_x + -1))->super_Feature).super_Element.m_tag + lVar29)
          ;
          local_168.vertices._12_4_ = 0.0;
          uVar5 = *(undefined8 *)((long)(&pNVar7->m_x + -2) + 8 + lVar29);
          local_1f8._0_4_ = (float)uVar5 + 0.0;
          local_1f8.m_size = (int)((float)((ulong)uVar5 >> 0x20) + 0.1);
          local_1f8.m_capacity =
               (int)(*(float *)((long)&(((Node *)(&pNVar7->m_x + -1))->super_Feature).super_Element.
                                       m_tag + lVar29) + 0.0);
          local_1f8._12_4_ = 0.0;
          local_208.m_floats = (btScalar  [4])ZEXT816(0x3f80000000000000);
          (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_168,&local_1f8,&local_208);
          local_168.vertices.m_capacity =
               (int)(*(float *)((long)&(((Node *)(&pNVar7->m_x + -1))->super_Feature).super_Element.
                                       m_tag + lVar29) + -0.1);
          local_168.vertices._0_8_ = *(undefined8 *)((long)(&pNVar7->m_x + -2) + 8 + lVar29);
          local_168.vertices._12_4_ = 0.0;
          uVar5 = *(undefined8 *)((long)(&pNVar7->m_x + -2) + 8 + lVar29);
          local_1f8._0_4_ = (float)uVar5 + 0.0;
          local_1f8.m_size = (int)((float)((ulong)uVar5 >> 0x20) + 0.0);
          local_1f8.m_capacity =
               (int)(*(float *)((long)&(((Node *)(&pNVar7->m_x + -1))->super_Feature).super_Element.
                                       m_tag + lVar29) + 0.1);
          local_1f8._12_4_ = 0.0;
          local_208.m_floats = (btScalar  [4])(ZEXT816(0x3f800000) << 0x40);
          (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_168,&local_1f8,&local_208);
        }
        lVar31 = lVar31 + 1;
        lVar29 = lVar29 + 0x78;
      } while (lVar31 < (local_1a0->m_nodes).m_size);
    }
    if (((local_188 & (undefined1  [16])0x2) != (undefined1  [16])0x0) &&
       (0 < (local_1a0->m_links).m_size)) {
      lVar29 = 0x18;
      lVar31 = 0;
      do {
        pLVar8 = (local_1a0->m_links).m_data;
        if ((*(byte *)(*(long *)((long)pLVar8->m_n + lVar29 + -0x20) + 0x14) & 1) != 0) {
          (*idraw->_vptr_btIDebugDraw[4])
                    (idraw,*(long *)((long)pLVar8->m_n + lVar29 + -0x18) + 0x10,
                     *(long *)((long)pLVar8->m_n + lVar29 + -0x10) + 0x10,&local_48);
        }
        lVar31 = lVar31 + 1;
        lVar29 = lVar29 + 0x48;
      } while (lVar31 < (local_1a0->m_links).m_size);
    }
    psb = local_1a0;
    if (((local_188 & (undefined1  [16])0x10) != (undefined1  [16])0x0) &&
       (0 < (local_1a0->m_nodes).m_size)) {
      lVar29 = 0x58;
      lVar31 = 0;
      do {
        pNVar7 = (psb->m_nodes).m_data;
        if ((*(byte *)(*(long *)((long)(&pNVar7->m_x + -6) + lVar29) + 0x14) & 1) != 0) {
          pfVar1 = (float *)((long)&(((Node *)(&pNVar7->m_x + -1))->super_Feature).super_Element.
                                    m_tag + lVar29);
          pfVar27 = pfVar1 + -0x12;
          local_1c8._0_4_ = *pfVar1 * 0.5;
          local_1b8[0] = (float)*(undefined8 *)(pfVar1 + -2) * 0.5;
          local_1b8[1] = (float)((ulong)*(undefined8 *)(pfVar1 + -2) >> 0x20) * 0.5;
          local_1b8[2] = 0.0;
          local_1b8[3] = 0.0;
          local_168.vertices._0_4_ = (float)*(undefined8 *)pfVar27 + local_1b8[0];
          local_168.vertices.m_size =
               (int)((float)((ulong)*(undefined8 *)pfVar27 >> 0x20) + local_1b8[1]);
          local_168.vertices.m_capacity = (int)(pfVar1[-0x10] + *pfVar1 * 0.5);
          local_168.vertices._12_4_ = 0.0;
          (*idraw->_vptr_btIDebugDraw[4])(idraw,pfVar27,&local_168,&local_88);
          local_168.vertices._0_4_ = (float)*(undefined8 *)pfVar27 - local_1b8[0];
          local_168.vertices.m_size =
               (int)((float)((ulong)*(undefined8 *)pfVar27 >> 0x20) - local_1b8[1]);
          local_168.vertices.m_capacity = (int)(pfVar1[-0x10] - (float)local_1c8._0_4_);
          local_168.vertices._12_4_ = 0.0;
          local_1f8._0_4_ = (float)local_88 * 0.5;
          local_1f8.m_size = (int)((float)((ulong)local_88 >> 0x20) * 0.5);
          local_1f8.m_capacity = (int)((float)uStack_80 * 0.5);
          local_1f8._12_4_ = 0.0;
          (*idraw->_vptr_btIDebugDraw[4])(idraw,pfVar27,&local_168,&local_1f8);
        }
        lVar31 = lVar31 + 1;
        lVar29 = lVar29 + 0x78;
      } while (lVar31 < (psb->m_nodes).m_size);
    }
    if ((local_188 & (undefined1  [16])0x20) != (undefined1  [16])0x0) {
      if (Draw(btSoftBody*,btIDebugDraw*,int)::axis == '\0') {
        Draw();
      }
      if (0 < (psb->m_rcontacts).m_size) {
        lVar31 = 8;
        lVar29 = 0;
        do {
          pRVar9 = (psb->m_rcontacts).m_data;
          lVar28 = *(long *)((long)(&(pRVar9->m_cti).m_normal + 1) + lVar31);
          fVar32 = *(float *)(lVar28 + 0x18);
          fVar44 = *(float *)((long)(pRVar9->m_cti).m_normal.m_floats + lVar31);
          uVar5 = *(undefined8 *)(lVar28 + 0x10);
          fVar33 = (float)uVar5;
          fVar36 = (float)((ulong)uVar5 >> 0x20);
          uVar5 = *(undefined8 *)((long)(pRVar9->m_cti).m_normal.m_floats + lVar31 + -8);
          fVar37 = (float)uVar5;
          fVar38 = (float)((ulong)uVar5 >> 0x20);
          fVar35 = fVar32 * fVar44 + fVar33 * fVar37 + fVar36 * fVar38 +
                   *(float *)((long)(pRVar9->m_cti).m_normal.m_floats + lVar31 + 8);
          local_168.vertices.m_size = (int)(fVar36 - fVar35 * fVar38);
          local_168.vertices._0_4_ = fVar33 - fVar35 * fVar37;
          local_168.vertices.m_capacity = (int)(fVar32 - fVar35 * fVar44);
          local_168.vertices._12_4_ = 0.0;
          fVar32 = *(float *)((long)(pRVar9->m_cti).m_normal.m_floats + lVar31 + -8);
          uVar5 = *(undefined8 *)((long)(pRVar9->m_cti).m_normal.m_floats + lVar31 + -4);
          fVar33 = (float)uVar5;
          fVar44 = fVar32;
          if (fVar33 <= fVar32) {
            fVar44 = fVar33;
          }
          uVar20 = (uint)(fVar33 <= fVar32);
          if (*(float *)((long)(pRVar9->m_cti).m_normal.m_floats + lVar31) <= fVar44) {
            uVar20 = 2;
          }
          uVar6 = *(undefined8 *)((long)Draw::axis[0].m_floats + (ulong)(uVar20 << 4) + 4);
          fVar44 = *(float *)((long)Draw::axis[0].m_floats + (ulong)(uVar20 << 4));
          fVar38 = (float)((ulong)uVar5 >> 0x20);
          fVar36 = (float)uVar6;
          fVar37 = (float)((ulong)uVar6 >> 0x20);
          local_1c8._0_4_ = fVar37 * fVar33 - fVar38 * fVar36;
          local_1c8._4_4_ = fVar44 * fVar38 - fVar32 * fVar37;
          uStack_1c0._0_4_ = fVar37 * 0.0 - fVar38 * 0.0;
          uStack_1c0._4_4_ = fVar37 * 0.0 - fVar38 * 0.0;
          local_1b8[0] = fVar32 * fVar36 - fVar44 * fVar33;
          fVar32 = local_1b8[0] * local_1b8[0] +
                   (float)local_1c8._0_4_ * (float)local_1c8._0_4_ +
                   (float)local_1c8._4_4_ * (float)local_1c8._4_4_;
          if (fVar32 < 0.0) {
            local_1b8 = (btScalar  [4])ZEXT416((uint)local_1b8[0]);
            fVar32 = sqrtf(fVar32);
            bVar39 = local_1b8[1];
            bVar40 = local_1b8[2];
            bVar41 = local_1b8[3];
          }
          else {
            fVar32 = SQRT(fVar32);
            bVar39 = (btScalar)0;
            bVar40 = (btScalar)0;
            bVar41 = (btScalar)0;
          }
          fVar32 = 1.0 / fVar32;
          fVar37 = local_1b8[0] * fVar32;
          fVar36 = (float)local_1c8._0_4_ * fVar32;
          local_1c8._4_4_ = (float)local_1c8._4_4_ * fVar32;
          uStack_1c0._0_4_ = (float)uStack_1c0 * fVar32;
          uStack_1c0._4_4_ = uStack_1c0._4_4_ * fVar32;
          fVar32 = *(float *)((long)(pRVar9->m_cti).m_normal.m_floats + lVar31 + -8);
          uVar5 = *(undefined8 *)((long)(pRVar9->m_cti).m_normal.m_floats + lVar31 + -4);
          fVar44 = (float)uVar5;
          fVar33 = (float)((ulong)uVar5 >> 0x20);
          local_1b8[0] = fVar33 * (float)local_1c8._4_4_ - fVar37 * fVar44;
          local_1b8[1] = fVar32 * fVar37 - fVar36 * fVar33;
          local_1c8._0_4_ = fVar36 * fVar44 - (float)local_1c8._4_4_ * fVar32;
          local_1b8[2] = fVar33 * (float)uStack_1c0 - (float)uStack_1c0 * 0.0;
          local_1b8[3] = fVar33 * uStack_1c0._4_4_ - uStack_1c0._4_4_ * 0.0;
          fVar32 = (float)local_1c8._0_4_ * (float)local_1c8._0_4_ +
                   local_1b8[0] * local_1b8[0] + local_1b8[1] * local_1b8[1];
          if (fVar32 < 0.0) {
            local_178[1] = (float)local_1c8._4_4_ * 0.5;
            local_178[0] = fVar36 * 0.5;
            local_178[2] = (float)uStack_1c0 * 0.0;
            local_178[3] = uStack_1c0._4_4_ * 0.0;
            local_108._4_4_ = bVar39;
            local_108._0_4_ = fVar37 * 0.5;
            local_108._8_4_ = bVar40;
            local_108._12_4_ = bVar41;
            fVar32 = sqrtf(fVar32);
            fVar44 = local_178[0];
            fVar33 = local_178[1];
            fVar36 = (float)local_108._0_4_;
          }
          else {
            fVar32 = SQRT(fVar32);
            fVar44 = fVar36 * 0.5;
            fVar33 = (float)local_1c8._4_4_ * 0.5;
            fVar36 = fVar37 * 0.5;
          }
          pbVar18 = local_1d0;
          fVar32 = 1.0 / fVar32;
          local_1c8._0_4_ = (float)local_1c8._0_4_ * fVar32;
          local_1b8[1] = local_1b8[1] * fVar32;
          local_1b8[0] = local_1b8[0] * fVar32;
          local_1b8[2] = local_1b8[2] * fVar32;
          local_1b8[3] = local_1b8[3] * fVar32;
          local_1f8._0_4_ = local_168.vertices._0_4_ - fVar44;
          local_1f8.m_size = (int)(local_168.vertices.m_size - fVar33);
          local_1f8.m_capacity = (int)((float)local_168.vertices.m_capacity - fVar36);
          local_1f8._12_4_ = 0.0;
          local_208.m_floats[1] = fVar33 + local_168.vertices.m_size;
          local_208.m_floats[0] = fVar44 + local_168.vertices._0_4_;
          local_208.m_floats[2] = fVar36 + (float)local_168.vertices.m_capacity;
          local_208.m_floats[3] = 0.0;
          (*local_1d0->_vptr_btIDebugDraw[4])(local_1d0,&local_1f8,&local_208,&local_78);
          local_1f8._0_4_ = local_168.vertices._0_4_ - local_1b8[0] * 0.5;
          local_1f8.m_size = (int)(local_168.vertices.m_size - local_1b8[1] * 0.5);
          local_1f8.m_capacity =
               (int)((float)local_168.vertices.m_capacity - (float)local_1c8._0_4_ * 0.5);
          local_1f8._12_4_ = 0.0;
          local_208.m_floats[1] = local_1b8[1] * 0.5 + local_168.vertices.m_size;
          local_208.m_floats[0] = local_1b8[0] * 0.5 + local_168.vertices._0_4_;
          local_208.m_floats[2] =
               (float)local_1c8._0_4_ * 0.5 + (float)local_168.vertices.m_capacity;
          local_208.m_floats[3] = 0.0;
          (*pbVar18->_vptr_btIDebugDraw[4])(pbVar18,&local_1f8,&local_208,&local_78);
          uVar5 = *(undefined8 *)((long)(pRVar9->m_cti).m_normal.m_floats + lVar31 + -8);
          local_1f8.m_size =
               (int)(local_168.vertices.m_size + (float)((ulong)uVar5 >> 0x20) * 0.5 * 3.0);
          local_1f8._0_4_ = local_168.vertices._0_4_ + (float)uVar5 * 0.5 * 3.0;
          local_1f8.m_capacity =
               (int)(*(float *)((long)(pRVar9->m_cti).m_normal.m_floats + lVar31) * 0.5 * 3.0 +
                    (float)local_168.vertices.m_capacity);
          local_1f8._12_4_ = 0.0;
          local_208.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
          (*pbVar18->_vptr_btIDebugDraw[4])(pbVar18,&local_168,&local_1f8,&local_208);
          lVar29 = lVar29 + 1;
          lVar31 = lVar31 + 0x78;
          psb = local_1a0;
        } while (lVar29 < (local_1a0->m_rcontacts).m_size);
      }
    }
    if ((local_188 & (undefined1  [16])0x4) != (undefined1  [16])0x0) {
      local_168.vertices._0_16_ = ZEXT816(0x3f33333300000000);
      if (0 < (psb->m_faces).m_size) {
        lVar31 = 0x20;
        lVar29 = 0;
        do {
          pFVar10 = (psb->m_faces).m_data;
          if ((*(byte *)(*(long *)((long)pFVar10->m_n + lVar31 + -0x28) + 0x14) & 1) != 0) {
            lVar28 = *(long *)((long)pFVar10->m_n + lVar31 + -0x20);
            lVar11 = *(long *)((long)pFVar10->m_n + lVar31 + -0x18);
            fVar32 = *(float *)(lVar11 + 0x18);
            lVar12 = *(long *)((long)pFVar10->m_n + lVar31 + -0x10);
            fVar44 = *(float *)(lVar12 + 0x18);
            fVar36 = (*(float *)(lVar28 + 0x18) + fVar32 + fVar44) * 0.33333334;
            uVar5 = *(undefined8 *)(lVar11 + 0x10);
            fVar37 = (float)uVar5;
            fVar38 = (float)((ulong)uVar5 >> 0x20);
            uVar5 = *(undefined8 *)(lVar12 + 0x10);
            fVar35 = (float)uVar5;
            fVar43 = (float)((ulong)uVar5 >> 0x20);
            fVar42 = (*(float *)(lVar28 + 0x10) + fVar37 + fVar35) * 0.33333334;
            fVar33 = (fVar43 + fVar38 + *(float *)(lVar28 + 0x14)) * 0.33333334;
            local_1f8.m_size = (int)((*(float *)(lVar28 + 0x14) - fVar33) * 0.8 + fVar33);
            local_1f8._0_4_ = fVar42 + (*(float *)(lVar28 + 0x10) - fVar42) * 0.8;
            local_1f8.m_capacity = (int)((*(float *)(lVar28 + 0x18) - fVar36) * 0.8 + fVar36);
            local_1f8._12_4_ = 0;
            local_208.m_floats[1] = (fVar38 - fVar33) * 0.8 + fVar33;
            local_208.m_floats[0] = (fVar37 - fVar42) * 0.8 + fVar42;
            local_208.m_floats[2] = (fVar32 - fVar36) * 0.8 + fVar36;
            local_208.m_floats[3] = 0.0;
            local_198._4_4_ = (fVar43 - fVar33) * 0.8 + fVar33;
            local_198._0_4_ = (fVar35 - fVar42) * 0.8 + fVar42;
            local_198._8_4_ = (fVar44 - fVar36) * 0.8 + fVar36;
            local_198._12_4_ = 0;
            (*local_1d0->_vptr_btIDebugDraw[9])
                      (local_1d0,&local_1f8,&local_208,local_198,&local_168);
          }
          lVar29 = lVar29 + 1;
          lVar31 = lVar31 + 0x48;
        } while (lVar29 < (psb->m_faces).m_size);
      }
    }
    pbVar18 = local_1d0;
    if (((local_188._0_4_ & 8) != 0) &&
       (local_168.vertices._8_8_ = 0x3f333333, local_168.vertices._0_8_ = 0x3e99999a3e99999a,
       0 < (psb->m_tetras).m_size)) {
      lVar31 = 0x28;
      lVar29 = 0;
      do {
        pTVar13 = (psb->m_tetras).m_data;
        if ((*(byte *)(*(long *)((long)pTVar13->m_n + lVar31 + -0x30) + 0x14) & 1) != 0) {
          lVar28 = *(long *)((long)pTVar13->m_n + lVar31 + -0x28);
          lVar11 = *(long *)((long)pTVar13->m_n + lVar31 + -0x20);
          lVar12 = *(long *)((long)pTVar13->m_n + lVar31 + -0x18);
          lVar14 = *(long *)((long)pTVar13->m_n + lVar31 + -0x10);
          _local_1c8 = ZEXT416((uint)*(float *)(lVar14 + 0x10));
          local_a8 = ZEXT416((uint)*(float *)(lVar14 + 0x14));
          local_98 = ZEXT416((uint)*(float *)(lVar14 + 0x18));
          fVar43 = (*(float *)(lVar28 + 0x10) + *(float *)(lVar11 + 0x10) +
                    *(float *)(lVar12 + 0x10) + *(float *)(lVar14 + 0x10)) * 0.25;
          fVar44 = (*(float *)(lVar28 + 0x14) + *(float *)(lVar11 + 0x14) +
                    *(float *)(lVar12 + 0x14) + *(float *)(lVar14 + 0x14)) * 0.25;
          fVar32 = (*(float *)(lVar28 + 0x18) + *(float *)(lVar11 + 0x18) +
                    *(float *)(lVar12 + 0x18) + *(float *)(lVar14 + 0x18)) * 0.25;
          fVar35 = (*(float *)(lVar28 + 0x10) - fVar43) * 0.8 + fVar43;
          fVar38 = (*(float *)(lVar28 + 0x14) - fVar44) * 0.8 + fVar44;
          fVar37 = (*(float *)(lVar28 + 0x18) - fVar32) * 0.8 + fVar32;
          local_1b8[1] = fVar38;
          local_1b8[0] = fVar35;
          local_1b8[2] = fVar37;
          local_1b8[3] = 0.0;
          fVar42 = (*(float *)(lVar11 + 0x10) - fVar43) * 0.8 + fVar43;
          fVar36 = (*(float *)(lVar11 + 0x14) - fVar44) * 0.8 + fVar44;
          fVar33 = (*(float *)(lVar11 + 0x18) - fVar32) * 0.8 + fVar32;
          local_108._4_4_ = fVar36;
          local_108._0_4_ = fVar42;
          local_108._8_4_ = fVar33;
          local_108._12_4_ = 0;
          local_d8._0_4_ = fVar43;
          local_e8 = CONCAT44(local_e8._4_4_,fVar44);
          local_f8 = CONCAT44(local_f8._4_4_,fVar32);
          fVar43 = (*(float *)(lVar12 + 0x10) - fVar43) * 0.8 + fVar43;
          fVar44 = (*(float *)(lVar12 + 0x14) - fVar44) * 0.8 + fVar44;
          fVar32 = (*(float *)(lVar12 + 0x18) - fVar32) * 0.8 + fVar32;
          local_178[1] = fVar44;
          local_178[0] = fVar43;
          local_178[2] = fVar32;
          local_178[3] = 0.0;
          local_1f8.m_size = (int)fVar38;
          local_1f8._0_4_ = fVar35;
          local_1f8.m_capacity = (int)fVar37;
          local_1f8._12_4_ = 0.0;
          local_208.m_floats[1] = fVar36;
          local_208.m_floats[0] = fVar42;
          local_208.m_floats[2] = fVar33;
          local_208.m_floats[3] = 0.0;
          local_198._4_4_ = fVar44;
          local_198._0_4_ = fVar43;
          local_198._8_4_ = fVar32;
          local_198._12_4_ = 0;
          (*pbVar18->_vptr_btIDebugDraw[9])(pbVar18,&local_1f8,&local_208,local_198,&local_168);
          auVar19 = local_108;
          abVar34 = local_1b8;
          local_1f8._0_4_ = local_1b8[0];
          local_1f8.m_size = (int)local_1b8[1];
          local_1f8.m_capacity = (int)local_1b8[2];
          local_1f8._12_4_ = local_1b8[3];
          local_208.m_floats[0] = (btScalar)local_108._0_4_;
          local_208.m_floats[1] = (btScalar)local_108._4_4_;
          local_208.m_floats[2] = (btScalar)local_108._8_4_;
          local_208.m_floats[3] = (btScalar)local_108._12_4_;
          local_1c8._0_4_ =
               ((float)local_1c8._0_4_ - (float)local_d8._0_4_) * 0.8 + (float)local_d8._0_4_;
          local_1c8._4_4_ = ((float)local_a8._0_4_ - (float)local_e8) * 0.8 + (float)local_e8;
          uStack_1c0._0_4_ = ((float)local_98._0_4_ - (float)local_f8) * 0.8 + (float)local_f8;
          uStack_1c0._4_4_ = 0.0;
          local_1b8 = abVar34;
          local_198 = _local_1c8;
          local_108 = auVar19;
          (*pbVar18->_vptr_btIDebugDraw[9])(pbVar18,&local_1f8,&local_208,local_198,&local_168);
          abVar34 = local_178;
          local_1f8._0_8_ = local_108._0_8_;
          local_1f8._8_8_ = local_108._8_8_;
          local_208.m_floats[0] = local_178[0];
          local_208.m_floats[1] = local_178[1];
          local_208.m_floats[2] = local_178[2];
          local_208.m_floats[3] = local_178[3];
          local_198._0_8_ = local_1c8;
          local_198._8_8_ = uStack_1c0;
          local_178 = abVar34;
          (*pbVar18->_vptr_btIDebugDraw[9])(pbVar18,&local_1f8,&local_208,local_198,&local_168);
          local_1f8._0_4_ = local_178[0];
          local_1f8.m_size = (int)local_178[1];
          local_1f8.m_capacity = (int)local_178[2];
          local_1f8._12_4_ = local_178[3];
          local_208.m_floats[0] = local_1b8[0];
          local_208.m_floats[1] = local_1b8[1];
          local_208.m_floats[2] = local_1b8[2];
          local_208.m_floats[3] = local_1b8[3];
          local_198 = _local_1c8;
          (*pbVar18->_vptr_btIDebugDraw[9])(pbVar18,&local_1f8,&local_208,local_198,&local_168);
        }
        lVar29 = lVar29 + 1;
        lVar31 = lVar31 + 0x88;
      } while (lVar29 < (psb->m_tetras).m_size);
    }
  }
  else {
    srand(0x70e);
    if (0 < (psb->m_clusters).m_size) {
      auVar26 = (undefined1  [8])0x0;
      do {
        if ((psb->m_clusters).m_data[(long)auVar26]->m_collide == true) {
          local_1c8 = auVar26;
          iVar23 = rand();
          iVar21 = rand();
          iVar22 = rand();
          local_208.m_floats[2] = (float)iVar22 * 4.656613e-10;
          local_208.m_floats[0] = (float)iVar23 * 4.656613e-10;
          local_208.m_floats[1] = (float)iVar21 * 4.656613e-10;
          local_208.m_floats[3] = 0.0;
          fVar32 = local_208.m_floats[2] * local_208.m_floats[2] +
                   local_208.m_floats[0] * local_208.m_floats[0] +
                   local_208.m_floats[1] * local_208.m_floats[1];
          if (fVar32 < 0.0) {
            local_1b8 = (btScalar  [4])ZEXT416((uint)local_208.m_floats[2]);
            local_178[1] = local_208.m_floats[1];
            local_178[0] = local_208.m_floats[0];
            local_178[2] = 0.0;
            local_178[3] = 0.0;
            fVar32 = sqrtf(fVar32);
            local_208.m_floats[2] = local_1b8[0];
            local_208.m_floats[0] = local_178[0];
            local_208.m_floats[1] = local_178[1];
          }
          else {
            fVar32 = SQRT(fVar32);
          }
          fVar32 = 1.0 / fVar32;
          local_208.m_floats[1] = local_208.m_floats[1] * fVar32 * 0.75;
          local_208.m_floats[0] = local_208.m_floats[0] * fVar32 * 0.75;
          local_208.m_floats[2] = local_208.m_floats[2] * fVar32 * 0.75;
          local_208.m_floats[3] = 0.0;
          local_1f8.m_ownsMemory = true;
          local_1f8.m_data = (btVector3 *)0x0;
          local_1f8._4_8_ = 0;
          iVar23 = ((psb->m_clusters).m_data[(long)local_1c8]->m_nodes).m_size;
          lVar29 = (long)iVar23;
          if (0 < lVar29) {
            pbVar24 = (btVector3 *)btAlignedAllocInternal(lVar29 << 4,0x10);
            if (0 < (long)local_1f8.m_size) {
              lVar31 = 0;
              do {
                puVar2 = (undefined8 *)((long)(local_1f8.m_data)->m_floats + lVar31);
                uVar5 = puVar2[1];
                puVar3 = (undefined8 *)((long)pbVar24->m_floats + lVar31);
                *puVar3 = *puVar2;
                puVar3[1] = uVar5;
                lVar31 = lVar31 + 0x10;
              } while ((long)local_1f8.m_size * 0x10 != lVar31);
            }
            if ((local_1f8.m_data != (btVector3 *)0x0) && (local_1f8.m_ownsMemory == true)) {
              btAlignedFreeInternal(local_1f8.m_data);
            }
            local_1f8.m_capacity = iVar23;
            local_1f8.m_data = pbVar24;
          }
          local_1f8.m_ownsMemory = true;
          local_1f8.m_size = iVar23;
          if (0 < iVar23) {
            lVar31 = 0;
            do {
              lVar28 = *(long *)((long)((psb->m_clusters).m_data[(long)local_1c8]->m_nodes).m_data +
                                lVar31);
              uVar5 = *(undefined8 *)(lVar28 + 0x18);
              puVar2 = (undefined8 *)((long)(local_1f8.m_data)->m_floats + lVar31 * 2);
              *puVar2 = *(undefined8 *)(lVar28 + 0x10);
              puVar2[1] = uVar5;
              lVar31 = lVar31 + 8;
            } while (lVar29 * 8 != lVar31);
          }
          local_168.vertices.m_ownsMemory = true;
          local_168.vertices.m_data = (btVector3 *)0x0;
          local_168.vertices._4_8_ = 0;
          local_168.edges.m_ownsMemory = true;
          local_168.edges.m_data = (Edge *)0x0;
          local_168.edges.m_size = 0;
          local_168.edges.m_capacity = 0;
          local_168.faces.m_ownsMemory = true;
          local_168.faces.m_data = (int *)0x0;
          local_168.faces.m_size = 0;
          local_168.faces.m_capacity = 0;
          btConvexHullComputer::compute(&local_168,local_1f8.m_data,false,0x10,iVar23,0.0,0.0);
          if (0 < local_168.faces.m_size) {
            lVar29 = 0;
            do {
              pEVar4 = local_168.edges.m_data + local_168.faces.m_data[lVar29];
              pEVar30 = pEVar4 + pEVar4->reverse + pEVar4[pEVar4->reverse].next;
              if (pEVar30 != pEVar4) {
                iVar23 = pEVar4[pEVar4->reverse].targetVertex;
                iVar21 = pEVar4->targetVertex;
                do {
                  iVar22 = pEVar30->targetVertex;
                  (*idraw->_vptr_btIDebugDraw[9])
                            (idraw,local_168.vertices.m_data + iVar23,
                             local_168.vertices.m_data + iVar21,local_168.vertices.m_data + iVar22,
                             &local_208);
                  pEVar30 = pEVar30 + pEVar30->reverse + pEVar30[pEVar30->reverse].next;
                  iVar23 = iVar21;
                  iVar21 = iVar22;
                } while (pEVar30 != pEVar4);
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 < local_168.faces.m_size);
          }
          btAlignedObjectArray<int>::~btAlignedObjectArray
                    ((btAlignedObjectArray<int> *)((long)&local_168 + 0x40));
          btAlignedObjectArray<btConvexHullComputer::Edge>::~btAlignedObjectArray
                    ((btAlignedObjectArray<btConvexHullComputer::Edge> *)((long)&local_168 + 0x20));
          btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_168.vertices);
          btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_1f8);
          auVar26 = local_1c8;
          psb = local_1a0;
        }
        auVar26 = (undefined1  [8])((long)auVar26 + 1);
      } while ((long)auVar26 < (long)(psb->m_clusters).m_size);
    }
  }
  pbVar18 = local_1d0;
  uVar20 = local_188._0_4_;
  if ((local_188 & (undefined1  [16])0x40) != (undefined1  [16])0x0) {
    if (0 < (psb->m_anchors).m_size) {
      lVar31 = 0;
      lVar29 = 0;
      do {
        pAVar15 = (psb->m_anchors).m_data;
        lVar28 = *(long *)((long)(pAVar15->m_c0).m_el[0].m_floats + lVar31 + -0xc);
        fVar32 = *(float *)((long)(pAVar15->m_local).m_floats + lVar31);
        fVar44 = *(float *)((long)(pAVar15->m_local).m_floats + lVar31 + 4);
        fVar33 = *(float *)((long)(pAVar15->m_local).m_floats + lVar31 + 8);
        local_168.vertices._0_4_ =
             (float)*(undefined8 *)(lVar28 + 0x38) +
             *(float *)(lVar28 + 0x10) * fVar33 +
             fVar32 * *(float *)(lVar28 + 8) + *(float *)(lVar28 + 0xc) * fVar44;
        local_168.vertices.m_size =
             (int)((float)((ulong)*(undefined8 *)(lVar28 + 0x38) >> 0x20) +
                  *(float *)(lVar28 + 0x20) * fVar33 +
                  fVar32 * *(float *)(lVar28 + 0x18) + *(float *)(lVar28 + 0x1c) * fVar44);
        local_168.vertices.m_capacity =
             (int)(*(float *)(lVar28 + 0x30) * fVar33 +
                   *(float *)(lVar28 + 0x28) * fVar32 + *(float *)(lVar28 + 0x2c) * fVar44 +
                  *(float *)(lVar28 + 0x40));
        local_168.vertices._12_4_ = 0.0;
        local_1f8._0_16_ = ZEXT816(0x3f800000);
        drawVertex(pbVar18,(btVector3 *)
                           (*(long *)((long)(pAVar15->m_local).m_floats + lVar31 + -8) + 0x10),0.25,
                   (btVector3 *)&local_1f8);
        local_1f8._0_16_ = ZEXT816(0x3f80000000000000);
        drawVertex(pbVar18,(btVector3 *)&local_168,0.25,(btVector3 *)&local_1f8);
        local_1f8._8_8_ = 0x3f800000;
        local_1f8._0_8_ = 0x3f8000003f800000;
        (*pbVar18->_vptr_btIDebugDraw[4])
                  (pbVar18,*(long *)((long)(pAVar15->m_local).m_floats + lVar31 + -8) + 0x10,
                   (btVector3 *)&local_168,(btVector3 *)&local_1f8);
        lVar29 = lVar29 + 1;
        lVar31 = lVar31 + 0x68;
        psb = local_1a0;
      } while (lVar29 < (local_1a0->m_anchors).m_size);
    }
    uVar20 = local_188._0_4_;
    if (0 < (psb->m_nodes).m_size) {
      lVar31 = 0x60;
      lVar29 = 0;
      do {
        pNVar7 = (psb->m_nodes).m_data;
        if (((*(byte *)(*(long *)((long)(&pNVar7->m_x + -7) + 8 + lVar31) + 0x14) & 1) != 0) &&
           (*(float *)((long)&(((Node *)(&pNVar7->m_x + -1))->super_Feature).super_Element.m_tag +
                      lVar31) <= 0.0)) {
          local_168.vertices._0_12_ = ZEXT812(0x3f800000);
          local_168.vertices._12_4_ = 0.0;
          drawVertex(local_1d0,(btVector3 *)((long)(&pNVar7->m_x + -6) + lVar31),0.25,
                     (btVector3 *)&local_168);
        }
        lVar29 = lVar29 + 1;
        lVar31 = lVar31 + 0x78;
        psb = local_1a0;
      } while (lVar29 < (local_1a0->m_nodes).m_size);
    }
  }
  if (((char)uVar20 < '\0') && (0 < (psb->m_notes).m_size)) {
    lVar29 = 0;
    lVar31 = 0;
    do {
      pNVar16 = (psb->m_notes).m_data;
      pbVar24 = &pNVar16[lVar31].m_offset;
      local_168.vertices._0_16_ = *&pbVar24->m_floats;
      if (0 < (long)pNVar16[lVar31].m_rank) {
        local_168.vertices._0_4_ = SUB84(*(undefined8 *)pbVar24->m_floats,0);
        local_168.vertices.m_size = (int)((ulong)*(undefined8 *)pbVar24->m_floats >> 0x20);
        local_168.vertices.m_capacity = (int)*(undefined8 *)(pbVar24->m_floats + 2);
        lVar28 = 0;
        fVar32 = (float)local_168.vertices._0_4_;
        fVar44 = (float)local_168.vertices.m_size;
        abVar34 = *&pbVar24->m_floats;
        fVar33 = (float)local_168.vertices.m_capacity;
        do {
          local_168.vertices._0_16_ = abVar34;
          auVar19 = (undefined1  [16])local_168.vertices._0_16_;
          lVar11 = *(long *)((long)pNVar16->m_nodes + lVar28 * 8 + lVar29);
          fVar36 = *(float *)((long)pNVar16->m_coords + lVar28 * 4 + lVar29);
          fVar33 = fVar33 + *(float *)(lVar11 + 0x18) * fVar36;
          uVar5 = *(undefined8 *)(lVar11 + 0x10);
          fVar32 = fVar32 + fVar36 * (float)uVar5;
          fVar44 = fVar44 + fVar36 * (float)((ulong)uVar5 >> 0x20);
          local_168.vertices.m_size = (int)fVar44;
          local_168.vertices._0_4_ = fVar32;
          local_168.vertices._12_4_ = auVar19._12_4_;
          local_168.vertices.m_capacity = (int)fVar33;
          lVar28 = lVar28 + 1;
          abVar34 = (btScalar  [4])local_168.vertices._0_16_;
        } while (pNVar16[lVar31].m_rank != lVar28);
      }
      (*local_1d0->_vptr_btIDebugDraw[0xc])(local_1d0,&local_168,pNVar16[lVar31].m_text);
      lVar31 = lVar31 + 1;
      lVar29 = lVar29 + 0x58;
    } while (lVar31 < (psb->m_notes).m_size);
  }
  if ((uVar20 >> 9 & 1) != 0) {
    local_168.vertices._8_8_ = 0x3f800000;
    local_168.vertices._0_8_ = 0x3f800000;
    local_1f8._8_8_ = 0x3f800000;
    local_1f8._0_8_ = 0x3f8000003f800000;
    drawTree(local_1d0,(psb->m_ndbvt).m_root,0,(btVector3 *)&local_168,(btVector3 *)&local_1f8,0,-1)
    ;
  }
  if ((uVar20 >> 10 & 1) != 0) {
    local_168.vertices._0_16_ = ZEXT816(0x3f80000000000000);
    local_1f8._0_12_ = ZEXT812(0x3f800000);
    local_1f8._12_4_ = 0.0;
    drawTree(local_1d0,(psb->m_fdbvt).m_root,0,(btVector3 *)&local_168,(btVector3 *)&local_1f8,0,-1)
    ;
  }
  abVar34._0_12_ = ZEXT812(0x3f800000);
  abVar34[3] = 0.0;
  if ((uVar20 >> 0xb & 1) != 0) {
    local_168.vertices._8_8_ = 0x3f800000;
    local_168.vertices._0_8_ = 0x3f80000000000000;
    local_1f8._0_16_ = abVar34;
    drawTree(local_1d0,(psb->m_cdbvt).m_root,0,(btVector3 *)&local_168,(btVector3 *)&local_1f8,0,-1)
    ;
  }
  if (((uVar20 >> 0xc & 1) != 0) && (0 < (psb->m_joints).m_size)) {
    lVar29 = 0;
    do {
      pJVar17 = (psb->m_joints).m_data[lVar29];
      iVar23 = (*pJVar17->_vptr_Joint[5])(pJVar17);
      if (iVar23 == 1) {
        pbVar25 = btSoftBody::Body::xform(pJVar17->m_bodies);
        local_168.vertices._0_16_ = *(undefined1 (*) [16])(pbVar25->m_origin).m_floats;
        pbVar25 = btSoftBody::Body::xform(pJVar17->m_bodies + 1);
        local_1f8._0_16_ = *(undefined1 (*) [16])(pbVar25->m_origin).m_floats;
        pbVar25 = btSoftBody::Body::xform(pJVar17->m_bodies);
        fVar32 = pJVar17->m_refs[0].m_floats[0];
        local_188 = ZEXT416((uint)fVar32);
        fVar44 = pJVar17->m_refs[0].m_floats[1];
        _local_c8 = ZEXT416((uint)fVar44);
        local_f8 = *(undefined8 *)(pbVar25->m_basis).m_el[0].m_floats;
        uStack_f0 = *(undefined8 *)((pbVar25->m_basis).m_el[0].m_floats + 2);
        local_e8 = *(undefined8 *)((pbVar25->m_basis).m_el[0].m_floats + 1);
        uStack_e0 = *(undefined8 *)((pbVar25->m_basis).m_el[0].m_floats + 3);
        _local_d8 = *(undefined1 (*) [16])((pbVar25->m_basis).m_el[0].m_floats + 2);
        fVar33 = pJVar17->m_refs[0].m_floats[2];
        local_178 = (btScalar  [4])ZEXT416((uint)fVar33);
        local_1b8 = (btScalar  [4])
                    ZEXT416((uint)((pbVar25->m_basis).m_el[2].m_floats[2] * fVar33 +
                                  (pbVar25->m_basis).m_el[2].m_floats[0] * fVar32 +
                                  (pbVar25->m_basis).m_el[2].m_floats[1] * fVar44));
        local_68 = ZEXT416((uint)(pbVar25->m_basis).m_el[1].m_floats[1]);
        local_58 = ZEXT416((uint)(pbVar25->m_basis).m_el[1].m_floats[0]);
        local_b8 = ZEXT416((uint)(pbVar25->m_basis).m_el[1].m_floats[2]);
        pbVar25 = btSoftBody::Body::xform(pJVar17->m_bodies + 1);
        pbVar18 = local_1d0;
        fVar32 = pJVar17->m_refs[1].m_floats[0];
        local_98 = ZEXT416((uint)fVar32);
        fVar44 = pJVar17->m_refs[1].m_floats[1];
        local_a8 = ZEXT416((uint)fVar44);
        fVar33 = pJVar17->m_refs[1].m_floats[2];
        _local_1c8 = ZEXT416((uint)fVar33);
        local_108 = ZEXT416((uint)((pbVar25->m_basis).m_el[2].m_floats[2] * fVar33 +
                                  (pbVar25->m_basis).m_el[2].m_floats[0] * fVar32 +
                                  (pbVar25->m_basis).m_el[2].m_floats[1] * fVar44));
        fVar37 = (float)local_e8 * (float)local_c8._0_4_;
        fVar38 = (float)local_68._0_4_ * (float)local_c8._0_4_;
        fVar35 = (float)uStack_e0 * (float)local_c8._0_4_;
        fVar42 = uStack_e0._4_4_ * (float)local_c8._0_4_;
        local_e8 = *(undefined8 *)(pbVar25->m_basis).m_el[0].m_floats;
        uStack_e0 = *(undefined8 *)((pbVar25->m_basis).m_el[0].m_floats + 2);
        _local_c8 = *(undefined1 (*) [16])((pbVar25->m_basis).m_el[0].m_floats + 1);
        fVar32 = (float)local_188._0_4_ * (float)local_f8;
        fVar44 = (float)local_188._0_4_ * (float)local_58._0_4_;
        fVar33 = (float)local_188._0_4_ * (float)uStack_f0;
        fVar36 = (float)local_188._0_4_ * uStack_f0._4_4_;
        local_f8 = *(undefined8 *)((pbVar25->m_basis).m_el[0].m_floats + 2);
        uStack_f0 = *(undefined8 *)(pbVar25->m_basis).m_el[1].m_floats;
        local_188 = ZEXT416((uint)(pbVar25->m_basis).m_el[1].m_floats[1]);
        local_1b8[0] = local_1b8[0] * 10.0;
        fVar43 = local_178[0] * (float)local_d8._8_4_;
        fStack_cc = local_178[0] * fStack_cc;
        fVar32 = (local_178[0] * (float)local_d8._0_4_ + fVar32 + fVar37) * 10.0;
        local_178[1] = (local_178[0] * (float)local_b8._0_4_ + fVar44 + fVar38) * 10.0;
        local_178[0] = fVar32;
        local_178[2] = (fVar43 + fVar33 + fVar35) * 0.0;
        local_178[3] = (fStack_cc + fVar36 + fVar42) * 0.0;
        local_208.m_floats[0] = local_168.vertices._0_4_ + fVar32;
        local_208.m_floats[1] = local_168.vertices.m_size + local_178[1];
        local_208.m_floats[2] = (float)local_168.vertices.m_capacity + local_1b8[0];
        local_208.m_floats[3] = 0.0;
        local_b8 = ZEXT416((uint)(pbVar25->m_basis).m_el[1].m_floats[2]);
        local_198 = ZEXT816(0x3f8000003f800000);
        _local_d8 = ZEXT416((uint)(pbVar25->m_basis).m_el[1].m_floats[0]);
        (*local_1d0->_vptr_btIDebugDraw[4])(local_1d0,&local_168,&local_208,local_198);
        local_108._0_4_ = (float)local_108._0_4_ * 10.0;
        fVar44 = (float)local_1c8._0_4_ * (float)uStack_f0;
        fVar33 = (float)local_1c8._0_4_ * uStack_f0._4_4_;
        fVar32 = ((float)local_1c8._0_4_ * (float)local_f8 +
                 (float)local_98._0_4_ * (float)local_e8 +
                 (float)local_c8._0_4_ * (float)local_a8._0_4_) * 10.0;
        local_1c8._4_4_ =
             ((float)local_1c8._0_4_ * (float)local_b8._0_4_ +
             (float)local_98._0_4_ * (float)local_d8._0_4_ +
             (float)local_188._0_4_ * (float)local_a8._0_4_) * 10.0;
        local_1c8._0_4_ = fVar32;
        uStack_1c0._0_4_ =
             (fVar44 + (float)local_98._0_4_ * (float)uStack_e0 +
                       (float)local_c8._8_4_ * (float)local_a8._0_4_) * 0.0;
        uStack_1c0._4_4_ =
             (fVar33 + (float)local_98._0_4_ * uStack_e0._4_4_ + fStack_bc * (float)local_a8._0_4_)
             * 0.0;
        local_208.m_floats[0] = local_168.vertices._0_4_ + fVar32;
        local_208.m_floats[1] = local_168.vertices.m_size + (float)local_1c8._4_4_;
        local_208.m_floats[2] = (float)local_168.vertices.m_capacity + (float)local_108._0_4_;
        local_208.m_floats[3] = 0.0;
        local_198 = ZEXT816(0x3f8000003f800000);
        (*pbVar18->_vptr_btIDebugDraw[4])(pbVar18,&local_168,&local_208,local_198);
        local_208.m_floats[0] = local_1f8._0_4_ + local_178[0];
        local_208.m_floats[1] = local_1f8.m_size + local_178[1];
        local_208.m_floats[2] = local_1b8[0] + (float)local_1f8.m_capacity;
        local_208.m_floats[3] = 0.0;
        local_198._0_8_ = 0x3f80000000000000;
        local_198._8_8_ = 0x3f800000;
        (*pbVar18->_vptr_btIDebugDraw[4])(pbVar18,&local_1f8,&local_208,local_198);
        local_208.m_floats[0] = local_1f8._0_4_ + (float)local_1c8._0_4_;
        local_208.m_floats[1] = local_1f8.m_size + (float)local_1c8._4_4_;
        local_208.m_floats[2] = (float)local_108._0_4_ + (float)local_1f8.m_capacity;
        local_208.m_floats[3] = 0.0;
        local_198._8_8_ = 0x3f800000;
        local_198._0_8_ = 0x3f80000000000000;
        (*pbVar18->_vptr_btIDebugDraw[4])(pbVar18,&local_1f8,&local_208,local_198);
      }
      else if (iVar23 == 0) {
        pbVar25 = btSoftBody::Body::xform(pJVar17->m_bodies);
        fVar32 = pJVar17->m_refs[0].m_floats[0];
        fVar44 = pJVar17->m_refs[0].m_floats[1];
        fVar33 = pJVar17->m_refs[0].m_floats[2];
        uVar5 = *(undefined8 *)(pbVar25->m_origin).m_floats;
        local_168.vertices._0_4_ =
             (float)uVar5 +
             (pbVar25->m_basis).m_el[0].m_floats[2] * fVar33 +
             (pbVar25->m_basis).m_el[0].m_floats[0] * fVar32 +
             (pbVar25->m_basis).m_el[0].m_floats[1] * fVar44;
        local_168.vertices.m_size =
             (int)((float)((ulong)uVar5 >> 0x20) +
                  (pbVar25->m_basis).m_el[1].m_floats[2] * fVar33 +
                  (pbVar25->m_basis).m_el[1].m_floats[0] * fVar32 +
                  (pbVar25->m_basis).m_el[1].m_floats[1] * fVar44);
        local_168.vertices.m_capacity =
             (int)((pbVar25->m_basis).m_el[2].m_floats[2] * fVar33 +
                   (pbVar25->m_basis).m_el[2].m_floats[0] * fVar32 +
                   (pbVar25->m_basis).m_el[2].m_floats[1] * fVar44 + (pbVar25->m_origin).m_floats[2]
                  );
        local_168.vertices._12_4_ = 0.0;
        pbVar25 = btSoftBody::Body::xform(pJVar17->m_bodies + 1);
        fVar32 = pJVar17->m_refs[1].m_floats[0];
        fVar44 = pJVar17->m_refs[1].m_floats[1];
        fVar33 = pJVar17->m_refs[1].m_floats[2];
        uVar5 = *(undefined8 *)(pbVar25->m_origin).m_floats;
        local_1f8._0_4_ =
             (float)uVar5 +
             (pbVar25->m_basis).m_el[0].m_floats[2] * fVar33 +
             (pbVar25->m_basis).m_el[0].m_floats[0] * fVar32 +
             (pbVar25->m_basis).m_el[0].m_floats[1] * fVar44;
        local_1f8.m_size =
             (int)((float)((ulong)uVar5 >> 0x20) +
                  (pbVar25->m_basis).m_el[1].m_floats[2] * fVar33 +
                  (pbVar25->m_basis).m_el[1].m_floats[0] * fVar32 +
                  (pbVar25->m_basis).m_el[1].m_floats[1] * fVar44);
        local_1f8.m_capacity =
             (int)((pbVar25->m_basis).m_el[2].m_floats[2] * fVar33 +
                   (pbVar25->m_basis).m_el[2].m_floats[0] * fVar32 +
                   (pbVar25->m_basis).m_el[2].m_floats[1] * fVar44 + (pbVar25->m_origin).m_floats[2]
                  );
        local_1f8._12_4_ = 0.0;
        pbVar25 = btSoftBody::Body::xform(pJVar17->m_bodies);
        pbVar18 = local_1d0;
        local_208.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
        (*local_1d0->_vptr_btIDebugDraw[4])
                  (local_1d0,&pbVar25->m_origin,(btVector3 *)&local_168,&local_208);
        pbVar25 = btSoftBody::Body::xform(pJVar17->m_bodies + 1);
        local_208.m_floats[0] = 0.0;
        local_208.m_floats[1] = 1.0;
        local_208.m_floats[2] = 1.0;
        local_208.m_floats[3] = 0.0;
        (*pbVar18->_vptr_btIDebugDraw[4])
                  (pbVar18,&pbVar25->m_origin,(btVector3 *)&local_1f8,&local_208);
        local_208.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
        drawVertex(pbVar18,(btVector3 *)&local_168,0.25,&local_208);
        local_208.m_floats[2] = 1.0;
        local_208.m_floats[3] = 0.0;
        local_208.m_floats[0] = 0.0;
        local_208.m_floats[1] = 1.0;
        drawVertex(pbVar18,(btVector3 *)&local_1f8,0.25,&local_208);
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < (psb->m_joints).m_size);
  }
  return;
}

Assistant:

void			btSoftBodyHelpers::Draw(	btSoftBody* psb,
										btIDebugDraw* idraw,
										int drawflags)
{
	const btScalar		scl=(btScalar)0.1;
	const btScalar		nscl=scl*5;
	const btVector3		lcolor=btVector3(0,0,0);
	const btVector3		ncolor=btVector3(1,1,1);
	const btVector3		ccolor=btVector3(1,0,0);
	int i,j,nj;

		/* Clusters	*/ 
	if(0!=(drawflags&fDrawFlags::Clusters))
	{
		srand(1806);
		for(i=0;i<psb->m_clusters.size();++i)
		{
			if(psb->m_clusters[i]->m_collide)
			{
				btVector3						color(	rand()/(btScalar)RAND_MAX,
					rand()/(btScalar)RAND_MAX,
					rand()/(btScalar)RAND_MAX);
				color=color.normalized()*0.75;
				btAlignedObjectArray<btVector3>	vertices;
				vertices.resize(psb->m_clusters[i]->m_nodes.size());
				for(j=0,nj=vertices.size();j<nj;++j)
				{				
					vertices[j]=psb->m_clusters[i]->m_nodes[j]->m_x;
				}
#define USE_NEW_CONVEX_HULL_COMPUTER
#ifdef USE_NEW_CONVEX_HULL_COMPUTER
				btConvexHullComputer	computer;
				int stride = sizeof(btVector3);
				int count = vertices.size();
				btScalar shrink=0.f;
				btScalar shrinkClamp=0.f;
				computer.compute(&vertices[0].getX(),stride,count,shrink,shrinkClamp);
				for (int i=0;i<computer.faces.size();i++)
				{

					int face = computer.faces[i];
					//printf("face=%d\n",face);
					const btConvexHullComputer::Edge*  firstEdge = &computer.edges[face];
					const btConvexHullComputer::Edge*  edge = firstEdge->getNextEdgeOfFace();

					int v0 = firstEdge->getSourceVertex();
					int v1 = firstEdge->getTargetVertex();
					while (edge!=firstEdge)
					{
						int v2 = edge->getTargetVertex();
						idraw->drawTriangle(computer.vertices[v0],computer.vertices[v1],computer.vertices[v2],color,1);
						edge = edge->getNextEdgeOfFace();
						v0=v1;
						v1=v2;
					};
				}
#else

				HullDesc		hdsc(QF_TRIANGLES,vertices.size(),&vertices[0]);
				HullResult		hres;
				HullLibrary		hlib;
				hdsc.mMaxVertices=vertices.size();
				hlib.CreateConvexHull(hdsc,hres);
				const btVector3	center=average(hres.m_OutputVertices);
				add(hres.m_OutputVertices,-center);
				mul(hres.m_OutputVertices,(btScalar)1);
				add(hres.m_OutputVertices,center);
				for(j=0;j<(int)hres.mNumFaces;++j)
				{
					const int idx[]={hres.m_Indices[j*3+0],hres.m_Indices[j*3+1],hres.m_Indices[j*3+2]};
					idraw->drawTriangle(hres.m_OutputVertices[idx[0]],
						hres.m_OutputVertices[idx[1]],
						hres.m_OutputVertices[idx[2]],
						color,1);
				}
				hlib.ReleaseResult(hres);
#endif

			}
			/* Velocities	*/ 
#if 0
			for(int j=0;j<psb->m_clusters[i].m_nodes.size();++j)
			{
				const btSoftBody::Cluster&	c=psb->m_clusters[i];
				const btVector3				r=c.m_nodes[j]->m_x-c.m_com;
				const btVector3				v=c.m_lv+btCross(c.m_av,r);
				idraw->drawLine(c.m_nodes[j]->m_x,c.m_nodes[j]->m_x+v,btVector3(1,0,0));
			}
#endif
			/* Frame		*/ 
	//		btSoftBody::Cluster& c=*psb->m_clusters[i];
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(10,0,0),btVector3(1,0,0));
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(0,10,0),btVector3(0,1,0));
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(0,0,10),btVector3(0,0,1));
		}
	}
	else
	{
		/* Nodes	*/ 
		if(0!=(drawflags&fDrawFlags::Nodes))
		{
			for(i=0;i<psb->m_nodes.size();++i)
			{
				const btSoftBody::Node&	n=psb->m_nodes[i];
				if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				idraw->drawLine(n.m_x-btVector3(scl,0,0),n.m_x+btVector3(scl,0,0),btVector3(1,0,0));
				idraw->drawLine(n.m_x-btVector3(0,scl,0),n.m_x+btVector3(0,scl,0),btVector3(0,1,0));
				idraw->drawLine(n.m_x-btVector3(0,0,scl),n.m_x+btVector3(0,0,scl),btVector3(0,0,1));
			}
		}
		/* Links	*/ 
		if(0!=(drawflags&fDrawFlags::Links))
		{
			for(i=0;i<psb->m_links.size();++i)
			{
				const btSoftBody::Link&	l=psb->m_links[i];
				if(0==(l.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				idraw->drawLine(l.m_n[0]->m_x,l.m_n[1]->m_x,lcolor);
			}
		}
		/* Normals	*/ 
		if(0!=(drawflags&fDrawFlags::Normals))
		{
			for(i=0;i<psb->m_nodes.size();++i)
			{
				const btSoftBody::Node&	n=psb->m_nodes[i];
				if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				const btVector3			d=n.m_n*nscl;
				idraw->drawLine(n.m_x,n.m_x+d,ncolor);
				idraw->drawLine(n.m_x,n.m_x-d,ncolor*0.5);
			}
		}
		/* Contacts	*/ 
		if(0!=(drawflags&fDrawFlags::Contacts))
		{
			static const btVector3		axis[]={btVector3(1,0,0),
				btVector3(0,1,0),
				btVector3(0,0,1)};
			for(i=0;i<psb->m_rcontacts.size();++i)
			{		
				const btSoftBody::RContact&	c=psb->m_rcontacts[i];
				const btVector3				o=	c.m_node->m_x-c.m_cti.m_normal*
					(btDot(c.m_node->m_x,c.m_cti.m_normal)+c.m_cti.m_offset);
				const btVector3				x=btCross(c.m_cti.m_normal,axis[c.m_cti.m_normal.minAxis()]).normalized();
				const btVector3				y=btCross(x,c.m_cti.m_normal).normalized();
				idraw->drawLine(o-x*nscl,o+x*nscl,ccolor);
				idraw->drawLine(o-y*nscl,o+y*nscl,ccolor);
				idraw->drawLine(o,o+c.m_cti.m_normal*nscl*3,btVector3(1,1,0));
			}
		}
		/* Faces	*/ 
	if(0!=(drawflags&fDrawFlags::Faces))
	{
		const btScalar	scl=(btScalar)0.8;
		const btScalar	alp=(btScalar)1;
		const btVector3	col(0,(btScalar)0.7,0);
		for(i=0;i<psb->m_faces.size();++i)
		{
			const btSoftBody::Face&	f=psb->m_faces[i];
			if(0==(f.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			const btVector3			x[]={f.m_n[0]->m_x,f.m_n[1]->m_x,f.m_n[2]->m_x};
			const btVector3			c=(x[0]+x[1]+x[2])/3;
			idraw->drawTriangle((x[0]-c)*scl+c,
				(x[1]-c)*scl+c,
				(x[2]-c)*scl+c,
				col,alp);
		}	
	}
	/* Tetras	*/ 
	if(0!=(drawflags&fDrawFlags::Tetras))
	{
		const btScalar	scl=(btScalar)0.8;
		const btScalar	alp=(btScalar)1;
		const btVector3	col((btScalar)0.3,(btScalar)0.3,(btScalar)0.7);
		for(int i=0;i<psb->m_tetras.size();++i)
		{
			const btSoftBody::Tetra&	t=psb->m_tetras[i];
			if(0==(t.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			const btVector3				x[]={t.m_n[0]->m_x,t.m_n[1]->m_x,t.m_n[2]->m_x,t.m_n[3]->m_x};
			const btVector3				c=(x[0]+x[1]+x[2]+x[3])/4;
			idraw->drawTriangle((x[0]-c)*scl+c,(x[1]-c)*scl+c,(x[2]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[0]-c)*scl+c,(x[1]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[1]-c)*scl+c,(x[2]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[2]-c)*scl+c,(x[0]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
		}	
	}
	}
	/* Anchors	*/ 
	if(0!=(drawflags&fDrawFlags::Anchors))
	{
		for(i=0;i<psb->m_anchors.size();++i)
		{
			const btSoftBody::Anchor&	a=psb->m_anchors[i];
			const btVector3				q=a.m_body->getWorldTransform()*a.m_local;
			drawVertex(idraw,a.m_node->m_x,0.25,btVector3(1,0,0));
			drawVertex(idraw,q,0.25,btVector3(0,1,0));
			idraw->drawLine(a.m_node->m_x,q,btVector3(1,1,1));
		}
		for(i=0;i<psb->m_nodes.size();++i)
		{
			const btSoftBody::Node&	n=psb->m_nodes[i];		
			if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			if(n.m_im<=0)
			{
				drawVertex(idraw,n.m_x,0.25,btVector3(1,0,0));
			}
		}
	}
	

	/* Notes	*/ 
	if(0!=(drawflags&fDrawFlags::Notes))
	{
		for(i=0;i<psb->m_notes.size();++i)
		{
			const btSoftBody::Note&	n=psb->m_notes[i];
			btVector3				p=n.m_offset;
			for(int j=0;j<n.m_rank;++j)
			{
				p+=n.m_nodes[j]->m_x*n.m_coords[j];
			}
			idraw->draw3dText(p,n.m_text);
		}
	}
	/* Node tree	*/ 
	if(0!=(drawflags&fDrawFlags::NodeTree))		DrawNodeTree(psb,idraw);
	/* Face tree	*/ 
	if(0!=(drawflags&fDrawFlags::FaceTree))		DrawFaceTree(psb,idraw);
	/* Cluster tree	*/ 
	if(0!=(drawflags&fDrawFlags::ClusterTree))	DrawClusterTree(psb,idraw);
	/* Joints		*/ 
	if(0!=(drawflags&fDrawFlags::Joints))
	{
		for(i=0;i<psb->m_joints.size();++i)
		{
			const btSoftBody::Joint*	pj=psb->m_joints[i];
			switch(pj->Type())
			{
			case	btSoftBody::Joint::eType::Linear:
				{
					const btSoftBody::LJoint*	pjl=(const btSoftBody::LJoint*)pj;
					const btVector3	a0=pj->m_bodies[0].xform()*pjl->m_refs[0];
					const btVector3	a1=pj->m_bodies[1].xform()*pjl->m_refs[1];
					idraw->drawLine(pj->m_bodies[0].xform().getOrigin(),a0,btVector3(1,1,0));
					idraw->drawLine(pj->m_bodies[1].xform().getOrigin(),a1,btVector3(0,1,1));
					drawVertex(idraw,a0,0.25,btVector3(1,1,0));
					drawVertex(idraw,a1,0.25,btVector3(0,1,1));
				}
				break;
			case	btSoftBody::Joint::eType::Angular:
				{
					//const btSoftBody::AJoint*	pja=(const btSoftBody::AJoint*)pj;
					const btVector3	o0=pj->m_bodies[0].xform().getOrigin();
					const btVector3	o1=pj->m_bodies[1].xform().getOrigin();
					const btVector3	a0=pj->m_bodies[0].xform().getBasis()*pj->m_refs[0];
					const btVector3	a1=pj->m_bodies[1].xform().getBasis()*pj->m_refs[1];
					idraw->drawLine(o0,o0+a0*10,btVector3(1,1,0));
					idraw->drawLine(o0,o0+a1*10,btVector3(1,1,0));
					idraw->drawLine(o1,o1+a0*10,btVector3(0,1,1));
					idraw->drawLine(o1,o1+a1*10,btVector3(0,1,1));
					break;
				}
				default:
				{
				}
					
			}		
		}
	}
}